

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_expanded_abi_cxx11_(Formatter *this,App *sub)

{
  bool bVar1;
  ostream *poVar2;
  App *in_RDX;
  long *in_RSI;
  string *in_RDI;
  string tmp;
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbf0;
  string *to;
  string *from;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  allocator<char> in_stack_fffffffffffffc77;
  App *in_stack_fffffffffffffc78;
  size_t in_stack_fffffffffffffc90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc98;
  ostream *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  allocator<char> local_2d9 [40];
  string local_2b1 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [48];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [12];
  AppFormatMode in_stack_fffffffffffffe7c;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  App::get_display_name_abi_cxx11_(in_stack_fffffffffffffc78,(bool)in_stack_fffffffffffffc77);
  poVar2 = ::std::operator<<(local_190,local_1c0);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string(in_stack_fffffffffffffbe0);
  (**(code **)(*in_RSI + 0x48))(local_1f0,in_RSI,in_RDX);
  ::std::operator<<(local_190,local_1f0);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffbe0);
  App::get_name_abi_cxx11_(in_RDX);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18acfa);
  if (bVar1) {
    App::get_aliases_abi_cxx11_(in_RDX);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_fffffffffffffbf0);
    if (!bVar1) {
      in_stack_fffffffffffffc28 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
      in_stack_fffffffffffffc30 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           App::get_aliases_abi_cxx11_(in_RDX);
      CLI::detail::format_aliases
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    }
  }
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
  (**(code **)(*in_RSI + 0x20))(local_210,in_RSI,in_RDX);
  ::std::operator<<((ostream *)this_01,local_210);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffbe0);
  str = (string *)local_190;
  make_groups_abi_cxx11_
            ((Formatter *)in_stack_fffffffffffffe88,(App *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe7c);
  ::std::operator<<((ostream *)str,local_230);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffbe0);
  from = (string *)local_190;
  (**(code **)(*in_RSI + 0x28))(local_250,in_RSI,in_RDX,2);
  ::std::operator<<((ostream *)from,local_250);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffbe0);
  ::std::__cxx11::stringstream::str();
  to = local_2b1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,(allocator<char> *)from);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,(allocator<char> *)from);
  CLI::detail::find_and_replace(str,from,to);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffbe0);
  ::std::allocator<char>::~allocator(local_2d9);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffbe0);
  ::std::allocator<char>::~allocator((allocator<char> *)local_2b1);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffbe0);
  pbVar3 = &local_270;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(pbVar3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (pbVar3,(size_type)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  pbVar3 = &local_300;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffbe0);
  ::std::__cxx11::string::string(this_01,str);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffc9f;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,(allocator<char> *)from);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)str,(allocator<char> *)from);
  CLI::detail::find_and_replace(str,from,to);
  ::std::operator+(pbVar3,(char *)this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc77);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc9f);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_expanded(const App *sub) const {
    std::stringstream out;
    out << sub->get_display_name(true) << "\n";

    out << make_description(sub);
    if(sub->get_name().empty() && !sub->get_aliases().empty()) {
        detail::format_aliases(out, sub->get_aliases(), column_width_ + 2);
    }
    out << make_positionals(sub);
    out << make_groups(sub, AppFormatMode::Sub);
    out << make_subcommands(sub, AppFormatMode::Sub);

    // Drop blank spaces
    std::string tmp = detail::find_and_replace(out.str(), "\n\n", "\n");
    tmp = tmp.substr(0, tmp.size() - 1);  // Remove the final '\n'

    // Indent all but the first line (the name)
    return detail::find_and_replace(tmp, "\n", "\n  ") + "\n";
}